

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmListFileBacktrace * __thiscall
cmMakefile::GetBacktrace
          (cmListFileBacktrace *__return_storage_ptr__,cmMakefile *this,cmCommandContext *cc)

{
  string local_98;
  undefined1 local_68 [8];
  cmListFileContext lfc;
  cmCommandContext *cc_local;
  cmMakefile *this_local;
  
  lfc.Line = (long)cc;
  cmListFileContext::cmListFileContext((cmListFileContext *)local_68);
  std::__cxx11::string::operator=((string *)local_68,(string *)lfc.Line);
  lfc.FilePath.field_2._8_8_ = *(undefined8 *)(lfc.Line + 0x20);
  cmStateSnapshot::GetExecutionListFile_abi_cxx11_(&local_98,&this->StateSnapshot);
  std::__cxx11::string::operator=((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_98)
  ;
  std::__cxx11::string::~string((string *)&local_98);
  cmListFileBacktrace::Push(__return_storage_ptr__,&this->Backtrace,(cmListFileContext *)local_68);
  cmListFileContext::~cmListFileContext((cmListFileContext *)local_68);
  return __return_storage_ptr__;
}

Assistant:

cmListFileBacktrace cmMakefile::GetBacktrace(cmCommandContext const& cc) const
{
  cmListFileContext lfc;
  lfc.Name = cc.Name;
  lfc.Line = cc.Line;
  lfc.FilePath = this->StateSnapshot.GetExecutionListFile();
  return this->Backtrace.Push(lfc);
}